

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode set_ssl_version_min_max(long *ctx_options,connectdata *conn,int sockindex)

{
  ssl_connect_data *local_48;
  long local_40;
  ssl_connect_data *connssl;
  long ssl_version_max;
  long ssl_version;
  int sockindex_local;
  connectdata *conn_local;
  long *ctx_options_local;
  
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_40 = (conn->proxy_ssl_config).version;
  }
  else {
    local_40 = (conn->ssl_config).version;
  }
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    local_48 = (ssl_connect_data *)(conn->proxy_ssl_config).version_max;
  }
  else {
    local_48 = (ssl_connect_data *)(conn->ssl_config).version_max;
  }
  connssl = local_48;
  if (local_48 == (ssl_connect_data *)0x0) {
    connssl = (ssl_connect_data *)(local_40 << 0x10);
  }
  switch(local_40) {
  case 7:
    SSL_CTX_ctrl((SSL_CTX *)conn->ssl[sockindex].ctx,0x7c,0x304,(void *)0x0);
    *ctx_options = *ctx_options | 0x8000000;
  case 6:
    *ctx_options = *ctx_options | 0x10000000;
  case 5:
    *ctx_options = *ctx_options | 0x4000000;
  case 4:
    *ctx_options = *ctx_options;
    *ctx_options = *ctx_options | 0x2000000;
  }
  if (connssl != (ssl_connect_data *)0x10000) {
    if (connssl == (ssl_connect_data *)0x40000) {
      *ctx_options = *ctx_options | 0x10000000;
    }
    else if (connssl != (ssl_connect_data *)0x50000) {
      if (connssl != (ssl_connect_data *)0x60000) {
        return CURLE_OK;
      }
      goto LAB_009a1ace;
    }
    *ctx_options = *ctx_options | 0x8000000;
  }
LAB_009a1ace:
  *ctx_options = *ctx_options | 0x20000000;
  return CURLE_OK;
}

Assistant:

static CURLcode
set_ssl_version_min_max(long *ctx_options, struct connectdata *conn,
                        int sockindex)
{
#if (OPENSSL_VERSION_NUMBER < 0x1000100FL) || !defined(TLS1_3_VERSION)
  /* convoluted #if condition just to avoid compiler warnings on unused
     variable */
  struct Curl_easy *data = conn->data;
#endif
  long ssl_version = SSL_CONN_CONFIG(version);
  long ssl_version_max = SSL_CONN_CONFIG(version_max);

  if(ssl_version_max == CURL_SSLVERSION_MAX_NONE) {
    ssl_version_max = ssl_version << 16;
  }

  switch(ssl_version) {
    case CURL_SSLVERSION_TLSv1_3:
#ifdef TLS1_3_VERSION
    {
      struct ssl_connect_data *connssl = &conn->ssl[sockindex];
      SSL_CTX_set_max_proto_version(connssl->ctx, TLS1_3_VERSION);
      *ctx_options |= SSL_OP_NO_TLSv1_2;
    }
#else
      (void)sockindex;
      failf(data, OSSL_PACKAGE " was built without TLS 1.3 support");
      return CURLE_NOT_BUILT_IN;
#endif
    case CURL_SSLVERSION_TLSv1_2:
#if OPENSSL_VERSION_NUMBER >= 0x1000100FL
      *ctx_options |= SSL_OP_NO_TLSv1_1;
#else
      failf(data, OSSL_PACKAGE " was built without TLS 1.2 support");
      return CURLE_NOT_BUILT_IN;
#endif
      /* FALLTHROUGH */
    case CURL_SSLVERSION_TLSv1_1:
#if OPENSSL_VERSION_NUMBER >= 0x1000100FL
      *ctx_options |= SSL_OP_NO_TLSv1;
#else
      failf(data, OSSL_PACKAGE " was built without TLS 1.1 support");
      return CURLE_NOT_BUILT_IN;
#endif
      /* FALLTHROUGH */
    case CURL_SSLVERSION_TLSv1_0:
      *ctx_options |= SSL_OP_NO_SSLv2;
      *ctx_options |= SSL_OP_NO_SSLv3;
      break;
  }

  switch(ssl_version_max) {
    case CURL_SSLVERSION_MAX_TLSv1_0:
#if OPENSSL_VERSION_NUMBER >= 0x1000100FL
      *ctx_options |= SSL_OP_NO_TLSv1_1;
#endif
      /* FALLTHROUGH */
    case CURL_SSLVERSION_MAX_TLSv1_1:
#if OPENSSL_VERSION_NUMBER >= 0x1000100FL
      *ctx_options |= SSL_OP_NO_TLSv1_2;
#endif
      /* FALLTHROUGH */
    case CURL_SSLVERSION_MAX_TLSv1_2:
    case CURL_SSLVERSION_MAX_DEFAULT:
#ifdef TLS1_3_VERSION
      *ctx_options |= SSL_OP_NO_TLSv1_3;
#endif
      break;
    case CURL_SSLVERSION_MAX_TLSv1_3:
#ifdef TLS1_3_VERSION
      break;
#else
      failf(data, OSSL_PACKAGE " was built without TLS 1.3 support");
      return CURLE_NOT_BUILT_IN;
#endif
  }
  return CURLE_OK;
}